

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall
glslang::TPpContext::eval
          (TPpContext *this,int token,int precedence,bool shortCircuit,int *res,bool *err,
          TPpToken *ppToken)

{
  bool bVar1;
  int iVar2;
  int token_00;
  MacroSymbol *pMVar3;
  uint local_7c;
  int local_68;
  int leftSide;
  int op_1;
  int op;
  MacroSymbol *macro;
  TString *pTStack_50;
  bool needclose;
  TSourceLoc loc;
  bool *err_local;
  int *res_local;
  int iStack_1c;
  bool shortCircuit_local;
  int precedence_local;
  int token_local;
  TPpContext *this_local;
  
  pTStack_50 = (ppToken->loc).name;
  loc.name = *(TString **)&(ppToken->loc).string;
  loc.string = (ppToken->loc).column;
  loc.line = *(int *)&(ppToken->loc).field_0x14;
  loc._16_8_ = err;
  if (token == 0xa2) {
    iVar2 = strcmp("defined",ppToken->name);
    if (iVar2 != 0) {
      iVar2 = tokenPaste(this,0xa2,ppToken);
      iVar2 = evalToToken(this,iVar2,shortCircuit,res,(bool *)loc._16_8_,ppToken);
      iVar2 = eval(this,iVar2,precedence,shortCircuit,res,(bool *)loc._16_8_,ppToken);
      return iVar2;
    }
    bVar1 = TParseVersions::isReadingHLSL(&this->parseContext->super_TParseVersions);
    if ((!bVar1) && (bVar1 = isMacroInput(this), bVar1)) {
      bVar1 = TParseVersions::relaxedErrors(&this->parseContext->super_TParseVersions);
      if (bVar1) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x30])
                  (this->parseContext,ppToken,
                   "nonportable when expanded from macros for preprocessor expression","defined","")
        ;
      }
      else {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,
                   "cannot use in preprocessor expression when expanded from macros","defined","");
      }
    }
    iStack_1c = scanToken(this,ppToken);
    bVar1 = iStack_1c == 0x28;
    if (bVar1) {
      iStack_1c = scanToken(this,ppToken);
    }
    if (iStack_1c != 0xa2) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,&stack0xffffffffffffffb0,
                 "incorrect directive, expected identifier","preprocessor evaluation","");
      *(undefined1 *)loc._16_8_ = 1;
      *res = 0;
      return iStack_1c;
    }
    iVar2 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    pMVar3 = lookupMacroDef(this,iVar2);
    if (pMVar3 == (MacroSymbol *)0x0) {
      local_7c = 0;
    }
    else {
      local_7c = (uint)((((byte)pMVar3->field_0x48 >> 2 & 1) != 0 ^ 0xffU) & 1);
    }
    *res = local_7c;
    iStack_1c = scanToken(this,ppToken);
    if (bVar1) {
      if (iStack_1c != 0x29) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&stack0xffffffffffffffb0,"expected \')\'",
                   "preprocessor evaluation","");
        *(undefined1 *)loc._16_8_ = 1;
        *res = 0;
        return iStack_1c;
      }
      iStack_1c = scanToken(this,ppToken);
    }
  }
  else if (token == 0x98) {
    *res = (ppToken->field_3).ival;
    iStack_1c = scanToken(this,ppToken);
  }
  else if (token == 0x28) {
    iVar2 = scanToken(this,ppToken);
    iStack_1c = eval(this,iVar2,0,shortCircuit,res,(bool *)loc._16_8_,ppToken);
    if ((*(byte *)loc._16_8_ & 1) == 0) {
      if (iStack_1c != 0x29) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&stack0xffffffffffffffb0,"expected \')\'",
                   "preprocessor evaluation","");
        *(undefined1 *)loc._16_8_ = 1;
        *res = 0;
        return iStack_1c;
      }
      iStack_1c = scanToken(this,ppToken);
    }
  }
  else {
    leftSide = 3;
    while ((-1 < leftSide &&
           (*(int *)((anonymous_namespace)::unop + (long)leftSide * 0x10) != token))) {
      leftSide = leftSide + -1;
    }
    if (leftSide < 0) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,&stack0xffffffffffffffb0,"bad expression",
                 "preprocessor evaluation","");
      *(undefined1 *)loc._16_8_ = 1;
      *res = 0;
      return token;
    }
    iVar2 = scanToken(this,ppToken);
    iStack_1c = eval(this,iVar2,0xc,shortCircuit,res,(bool *)loc._16_8_,ppToken);
    iVar2 = (**(code **)((anonymous_namespace)::unop + (long)leftSide * 0x10 + 8))(*res);
    *res = iVar2;
  }
  iStack_1c = evalToToken(this,iStack_1c,shortCircuit,res,(bool *)loc._16_8_,ppToken);
  res_local._7_1_ = shortCircuit;
  while( true ) {
    if (((((*(byte *)loc._16_8_ ^ 0xff) & 1) == 0) || (iStack_1c == 0x29)) || (iStack_1c == 10)) {
      return iStack_1c;
    }
    local_68 = 0x11;
    while ((-1 < local_68 &&
           (*(int *)((anonymous_namespace)::binop + (long)local_68 * 0x10) != iStack_1c))) {
      local_68 = local_68 + -1;
    }
    if (local_68 < 0) break;
    if (*(int *)((anonymous_namespace)::binop + (long)local_68 * 0x10 + 4) <= precedence) {
      return iStack_1c;
    }
    iVar2 = *res;
    if (((res_local._7_1_ & 1) == 0) &&
       (((iStack_1c == 0x8e && (iVar2 == 1)) || ((iStack_1c == 0x8d && (iVar2 == 0)))))) {
      res_local._7_1_ = 1;
    }
    token_00 = scanToken(this,ppToken);
    iStack_1c = eval(this,token_00,
                     *(int *)((anonymous_namespace)::binop + (long)local_68 * 0x10 + 4),
                     (bool)(res_local._7_1_ & 1),res,(bool *)loc._16_8_,ppToken);
    if (((*(code **)((anonymous_namespace)::binop + (long)local_68 * 0x10 + 8) ==
          anon_unknown_6::op_div) ||
        (*(code **)((anonymous_namespace)::binop + (long)local_68 * 0x10 + 8) ==
         anon_unknown_6::op_mod)) && (*res == 0)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,&stack0xffffffffffffffb0,"division by 0",
                 "preprocessor evaluation","");
      *res = 1;
    }
    iVar2 = (**(code **)((anonymous_namespace)::binop + (long)local_68 * 0x10 + 8))(iVar2,*res);
    *res = iVar2;
  }
  return iStack_1c;
}

Assistant:

int TPpContext::eval(int token, int precedence, bool shortCircuit, int& res, bool& err, TPpToken* ppToken)
{
    TSourceLoc loc = ppToken->loc;  // because we sometimes read the newline before reporting the error
    if (token == PpAtomIdentifier) {
        if (strcmp("defined", ppToken->name) == 0) {
            if (! parseContext.isReadingHLSL() && isMacroInput()) {
                if (parseContext.relaxedErrors())
                    parseContext.ppWarn(ppToken->loc, "nonportable when expanded from macros for preprocessor expression",
                        "defined", "");
                else
                    parseContext.ppError(ppToken->loc, "cannot use in preprocessor expression when expanded from macros",
                        "defined", "");
            }
            bool needclose = 0;
            token = scanToken(ppToken);
            if (token == '(') {
                needclose = true;
                token = scanToken(ppToken);
            }
            if (token != PpAtomIdentifier) {
                parseContext.ppError(loc, "incorrect directive, expected identifier", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }

            MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
            res = macro != nullptr ? !macro->undef : 0;
            token = scanToken(ppToken);
            if (needclose) {
                if (token != ')') {
                    parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                    err = true;
                    res = 0;

                    return token;
                }
                token = scanToken(ppToken);
            }
        } else {
            token = tokenPaste(token, *ppToken);
            token = evalToToken(token, shortCircuit, res, err, ppToken);
            return eval(token, precedence, shortCircuit, res, err, ppToken);
        }
    } else if (token == PpAtomConstInt) {
        res = ppToken->ival;
        token = scanToken(ppToken);
    } else if (token == '(') {
        token = scanToken(ppToken);
        token = eval(token, MIN_PRECEDENCE, shortCircuit, res, err, ppToken);
        if (! err) {
            if (token != ')') {
                parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }
            token = scanToken(ppToken);
        }
    } else {
        int op = NUM_ELEMENTS(unop) - 1;
        for (; op >= 0; op--) {
            if (unop[op].token == token)
                break;
        }
        if (op >= 0) {
            token = scanToken(ppToken);
            token = eval(token, UNARY, shortCircuit, res, err, ppToken);
            res = unop[op].op(res);
        } else {
            parseContext.ppError(loc, "bad expression", "preprocessor evaluation", "");
            err = true;
            res = 0;

            return token;
        }
    }

    token = evalToToken(token, shortCircuit, res, err, ppToken);

    // Perform evaluation of binary operation, if there is one, otherwise we are done.
    while (! err) {
        if (token == ')' || token == '\n')
            break;
        int op;
        for (op = NUM_ELEMENTS(binop) - 1; op >= 0; op--) {
            if (binop[op].token == token)
                break;
        }
        if (op < 0 || binop[op].precedence <= precedence)
            break;
        int leftSide = res;

        // Setup short-circuiting, needed for ES, unless already in a short circuit.
        // (Once in a short-circuit, can't turn off again, until that whole subexpression is done.
        if (! shortCircuit) {
            if ((token == PpAtomOr  && leftSide == 1) ||
                (token == PpAtomAnd && leftSide == 0))
                shortCircuit = true;
        }

        token = scanToken(ppToken);
        token = eval(token, binop[op].precedence, shortCircuit, res, err, ppToken);

        if (binop[op].op == op_div || binop[op].op == op_mod) {
            if (res == 0) {
                parseContext.ppError(loc, "division by 0", "preprocessor evaluation", "");
                res = 1;
            }
        }
        res = binop[op].op(leftSide, res);
    }

    return token;
}